

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::setScene(QGraphicsView *this,QGraphicsScene *scene)

{
  long lVar1;
  ulong uVar2;
  undefined1 *puVar3;
  WidgetAttribute attribute;
  bool bVar4;
  QGraphicsViewPrivate *this_00;
  QGraphicsScene *pQVar5;
  QGraphicsScenePrivate *pQVar6;
  QObject *pQVar7;
  QGraphicsViewPrivate *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar8;
  QGraphicsViewPrivate *d;
  QEvent windowActivate;
  QEvent windowDeactivate;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  FocusReason focusReason;
  QGraphicsViewPrivate *this_01;
  QWidget *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffc8;
  qreal local_30;
  Connection local_28;
  QEvent local_20 [3];
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QGraphicsView *)0xa37625);
  bVar4 = ::operator==((QPointer<QGraphicsScene> *)in_RDI,
                       (QGraphicsScene **)
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (bVar4) goto LAB_00a37a17;
  QGraphicsViewPrivate::updateAll(in_RDI);
  bVar4 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa37666);
  if (bVar4) {
    pQVar7 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa37680)->
              super_QObject;
    QObject::disconnect(pQVar7,"2changed(QList<QRectF>)",(QObject *)in_RDI,
                        "1updateScene(QList<QRectF>)");
    pQVar7 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa376ac)->
              super_QObject;
    QObject::disconnect(pQVar7,"2sceneRectChanged(QRectF)",(QObject *)in_RDI,
                        "1updateSceneRect(QRectF)");
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa376d8);
    QGraphicsScene::d_func((QGraphicsScene *)0xa376e0);
    QGraphicsScenePrivate::removeView
              ((QGraphicsScenePrivate *)0xa376ed,
               (QGraphicsView *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    *(uint *)&this_00->field_0x300 = *(uint *)&this_00->field_0x300 & 0xfffffffb;
    bVar4 = QWidget::isActiveWindow(in_stack_ffffffffffffffc8);
    if ((bVar4) && (bVar4 = QWidget::isVisible((QWidget *)0xa3771e), bVar4)) {
      _local_20 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffffe8 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent(local_20,WindowDeactivate);
      pQVar7 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3775c)->
                super_QObject;
      QCoreApplication::sendEvent(pQVar7,local_20);
      QEvent::~QEvent(local_20);
    }
    bVar4 = QWidget::hasFocus(in_stack_ffffffffffffff98);
    if (bVar4) {
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa37794);
      QGraphicsScene::clearFocus((QGraphicsScene *)in_RDI);
    }
  }
  QPointer<QGraphicsScene>::operator=
            ((QPointer<QGraphicsScene> *)in_RDI,
             (QGraphicsScene *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  bVar4 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa377bc);
  if (bVar4) {
    pQVar5 = ::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa377d6);
    QObject::connect((QObject *)&local_28,(char *)pQVar5,(QObject *)"2sceneRectChanged(QRectF)",
                     (char *)in_RDI,0xb4723a);
    QMetaObject::Connection::~Connection(&local_28);
    this_00->updateSceneSlotReimplementedChecked = false;
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa37820);
    QGraphicsScene::d_func((QGraphicsScene *)0xa37828);
    QGraphicsScenePrivate::addView((QGraphicsScenePrivate *)this_01,(QGraphicsView *)this_00);
    QGraphicsViewPrivate::recalculateContentSize(_windowActivate);
    sceneRect((QGraphicsView *)this_01);
    QVar8 = QRectF::center((QRectF *)this_00);
    (this_00->lastCenterPoint).xp = QVar8.xp;
    local_30 = QVar8.yp;
    (this_00->lastCenterPoint).yp = local_30;
    *(uint *)&this_00->field_0x300 = *(uint *)&this_00->field_0x300 & 0xffffff7f | 0x80;
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa378af);
    focusReason = (FocusReason)((ulong)this_00 >> 0x20);
    pQVar6 = QGraphicsScene::d_func((QGraphicsScene *)0xa378b7);
    if ((*(uint *)&pQVar6->field_0xb8 >> 0xc & 1) == 0) {
LAB_00a378f2:
      QWidget::setMouseTracking((QWidget *)in_RDI,(bool)in_stack_ffffffffffffff7f);
    }
    else {
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa378d9);
      pQVar6 = QGraphicsScene::d_func((QGraphicsScene *)0xa378e1);
      if ((*(uint *)&pQVar6->field_0xb8 >> 0xd & 1) == 0) goto LAB_00a378f2;
    }
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa37919);
    pQVar6 = QGraphicsScene::d_func((QGraphicsScene *)0xa37921);
    puVar3 = _local_20;
    if ((*(uint *)&pQVar6->field_0xb8 >> 0x10 & 1) == 0) {
      uVar2 = (ulong)_local_20 >> 0x20;
      attribute = (WidgetAttribute)uVar2;
      bVar4 = SUB81((ulong)puVar3 >> 0x18,0);
      _local_20 = puVar3;
      QWidget::setAttribute(in_stack_ffffffffffffffe8,attribute,bVar4);
    }
    bVar4 = QWidget::isActiveWindow((QWidget *)QVar8.xp);
    if ((bVar4) && (bVar4 = QWidget::isVisible((QWidget *)0xa37967), bVar4)) {
      in_stack_ffffffffffffff98 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&stack0xffffffffffffff98,WindowActivate);
      pQVar7 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa379a5)->
                super_QObject;
      QCoreApplication::sendEvent(pQVar7,(QEvent *)&stack0xffffffffffffff98);
      QEvent::~QEvent((QEvent *)&stack0xffffffffffffff98);
    }
  }
  else {
    QGraphicsViewPrivate::recalculateContentSize(_windowActivate);
    focusReason = (FocusReason)((ulong)this_00 >> 0x20);
  }
  QGraphicsViewPrivate::updateInputMethodSensitivity(in_RSI);
  bVar4 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa379e3);
  if ((bVar4) && (bVar4 = QWidget::hasFocus(in_stack_ffffffffffffff98), bVar4)) {
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa37a0a);
    QGraphicsScene::setFocus((QGraphicsScene *)this_01,focusReason);
  }
LAB_00a37a17:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::setScene(QGraphicsScene *scene)
{
    Q_D(QGraphicsView);
    if (d->scene == scene)
        return;

    // Always update the viewport when the scene changes.
    d->updateAll();

    // Remove the previously assigned scene.
    if (d->scene) {
        disconnect(d->scene, SIGNAL(changed(QList<QRectF>)),
                   this, SLOT(updateScene(QList<QRectF>)));
        disconnect(d->scene, SIGNAL(sceneRectChanged(QRectF)),
                   this, SLOT(updateSceneRect(QRectF)));
        d->scene->d_func()->removeView(this);
        d->connectedToScene = false;

        if (isActiveWindow() && isVisible()) {
            QEvent windowDeactivate(QEvent::WindowDeactivate);
            QCoreApplication::sendEvent(d->scene, &windowDeactivate);
        }
        if (hasFocus())
            d->scene->clearFocus();
    }

    // Assign the new scene and update the contents (scrollbars, etc.)).
    if ((d->scene = scene)) {
        connect(d->scene, SIGNAL(sceneRectChanged(QRectF)),
                this, SLOT(updateSceneRect(QRectF)));
        d->updateSceneSlotReimplementedChecked = false;
        d->scene->d_func()->addView(this);
        d->recalculateContentSize();
        d->lastCenterPoint = sceneRect().center();
        d->keepLastCenterPoint = true;
        // We are only interested in mouse tracking if items accept
        // hover events or use non-default cursors.
        if (!d->scene->d_func()->allItemsIgnoreHoverEvents
            || !d->scene->d_func()->allItemsUseDefaultCursor) {
            d->viewport->setMouseTracking(true);
        }

        // enable touch events if any items is interested in them
        if (!d->scene->d_func()->allItemsIgnoreTouchEvents)
            d->viewport->setAttribute(Qt::WA_AcceptTouchEvents);

        if (isActiveWindow() && isVisible()) {
            QEvent windowActivate(QEvent::WindowActivate);
            QCoreApplication::sendEvent(d->scene, &windowActivate);
        }
    } else {
        d->recalculateContentSize();
    }

    d->updateInputMethodSensitivity();

    if (d->scene && hasFocus())
        d->scene->setFocus();
}